

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDBusUnixFileDescriptor>::insert
          (QMovableArrayOps<QDBusUnixFileDescriptor> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QDBusUnixFileDescriptor *pQVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QDBusUnixFileDescriptor copy;
  Inserter local_60;
  QDBusUnixFileDescriptor local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d.ptr = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDBusUnixFileDescriptor::QDBusUnixFileDescriptor(&local_38,t);
  bVar3 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
          super_QArrayDataPointer<QDBusUnixFileDescriptor>.size != 0;
  QArrayDataPointer<QDBusUnixFileDescriptor>::detachAndGrow
            ((QArrayDataPointer<QDBusUnixFileDescriptor> *)this,(uint)(i == 0 && bVar3),n,
             (QDBusUnixFileDescriptor **)0x0,(QArrayDataPointer<QDBusUnixFileDescriptor> *)0x0);
  if (i == 0 && bVar3) {
    if (n != 0) {
      pQVar2 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
               super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr;
      do {
        QDBusUnixFileDescriptor::QDBusUnixFileDescriptor(pQVar2 + -1,&local_38);
        pQVar2 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                 super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr;
        pqVar1 = &(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                  super_QArrayDataPointer<QDBusUnixFileDescriptor>.size;
        *pqVar1 = *pqVar1 + 1;
        pQVar2 = pQVar2 + -1;
        (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
        super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr = pQVar2;
        n = n + -1;
      } while (n != 0);
    }
  }
  else {
    pQVar2 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
             super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr + i;
    local_60.displaceTo = pQVar2 + n;
    local_60.bytes =
         ((this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
          super_QArrayDataPointer<QDBusUnixFileDescriptor>.size - i) * 8;
    local_60.data = (QArrayDataPointer<QDBusUnixFileDescriptor> *)this;
    local_60.displaceFrom = pQVar2;
    local_60.nInserts = n;
    memmove(local_60.displaceTo,pQVar2,local_60.bytes);
    if (n != 0) {
      do {
        QDBusUnixFileDescriptor::QDBusUnixFileDescriptor(pQVar2,&local_38);
        pQVar2 = pQVar2 + 1;
        n = n + -1;
        local_60.displaceFrom = pQVar2;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_60);
  }
  QDBusUnixFileDescriptor::~QDBusUnixFileDescriptor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }